

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclableObjectDisplay::RecyclableObjectDisplay
          (RecyclableObjectDisplay *this,ResolvedObject *resolvedObject,
          DBGPROP_ATTRIB_FLAGS defaultAttributes)

{
  Var local_38;
  DBGPROP_ATTRIB_FLAGS defaultAttributes_local;
  ResolvedObject *resolvedObject_local;
  RecyclableObjectDisplay *this_local;
  
  IDiagObjectModelDisplay::IDiagObjectModelDisplay(&this->super_IDiagObjectModelDisplay);
  (this->super_IDiagObjectModelDisplay)._vptr_IDiagObjectModelDisplay =
       (_func_int **)&PTR_Name_01dea898;
  this->scriptContext = resolvedObject->scriptContext;
  this->instance = resolvedObject->obj;
  if (resolvedObject->originalObj == (Var)0x0) {
    local_38 = resolvedObject->obj;
  }
  else {
    local_38 = resolvedObject->originalObj;
  }
  this->originalInstance = local_38;
  this->name = resolvedObject->name;
  this->pObjAddress = resolvedObject->address;
  this->defaultAttributes = defaultAttributes;
  this->propertyId = resolvedObject->propId;
  return;
}

Assistant:

RecyclableObjectDisplay::RecyclableObjectDisplay(ResolvedObject* resolvedObject, DBGPROP_ATTRIB_FLAGS defaultAttributes)
        : scriptContext(resolvedObject->scriptContext),
          instance(resolvedObject->obj),
          originalInstance(resolvedObject->originalObj != nullptr ? resolvedObject->originalObj : resolvedObject->obj), // If we don't have it set it means originalInstance should point to object itself
          name(resolvedObject->name),
          pObjAddress(resolvedObject->address),
          defaultAttributes(defaultAttributes),
          propertyId(resolvedObject->propId)
    {
    }